

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::FBXConverter::SetTextureProperties
          (FBXConverter *this,aiMaterial *out_mat,TextureMap *textures,MeshGeometry *mesh)

{
  MeshGeometry *pMVar1;
  TextureMap *pTVar2;
  allocator local_4b9;
  string local_4b8;
  allocator local_491;
  string local_490;
  allocator local_469;
  string local_468;
  allocator local_441;
  string local_440;
  allocator local_419;
  string local_418;
  allocator local_3f1;
  string local_3f0;
  allocator local_3c9;
  string local_3c8;
  allocator local_3a1;
  string local_3a0;
  allocator local_379;
  string local_378;
  allocator local_351;
  string local_350;
  allocator local_329;
  string local_328;
  allocator local_301;
  string local_300;
  allocator local_2d9;
  string local_2d8;
  allocator local_2b1;
  string local_2b0;
  allocator local_289;
  string local_288;
  allocator local_261;
  string local_260;
  allocator local_239;
  string local_238;
  allocator local_211;
  string local_210;
  allocator local_1e9;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  allocator local_199;
  string local_198;
  allocator local_171;
  string local_170;
  allocator local_149;
  string local_148;
  allocator local_121;
  string local_120;
  allocator local_f9;
  string local_f8;
  allocator local_d1;
  string local_d0;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  MeshGeometry *local_28;
  MeshGeometry *mesh_local;
  TextureMap *textures_local;
  aiMaterial *out_mat_local;
  FBXConverter *this_local;
  
  local_28 = mesh;
  mesh_local = (MeshGeometry *)textures;
  textures_local = (TextureMap *)out_mat;
  out_mat_local = (aiMaterial *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"DiffuseColor",&local_49);
  TrySetTextureProperties(this,out_mat,textures,&local_48,aiTextureType_DIFFUSE,local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  pTVar2 = textures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"AmbientColor",&local_81);
  TrySetTextureProperties
            (this,(aiMaterial *)pTVar2,(TextureMap *)pMVar1,&local_80,aiTextureType_AMBIENT,local_28
            );
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  pTVar2 = textures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"EmissiveColor",&local_a9);
  TrySetTextureProperties
            (this,(aiMaterial *)pTVar2,(TextureMap *)pMVar1,&local_a8,aiTextureType_EMISSIVE,
             local_28);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  pTVar2 = textures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"SpecularColor",&local_d1);
  TrySetTextureProperties
            (this,(aiMaterial *)pTVar2,(TextureMap *)pMVar1,&local_d0,aiTextureType_SPECULAR,
             local_28);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  pTVar2 = textures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"SpecularFactor",&local_f9);
  TrySetTextureProperties
            (this,(aiMaterial *)pTVar2,(TextureMap *)pMVar1,&local_f8,aiTextureType_SPECULAR,
             local_28);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  pTVar2 = textures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,"TransparentColor",&local_121);
  TrySetTextureProperties
            (this,(aiMaterial *)pTVar2,(TextureMap *)pMVar1,&local_120,aiTextureType_OPACITY,
             local_28);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  pTVar2 = textures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_148,"ReflectionColor",&local_149);
  TrySetTextureProperties
            (this,(aiMaterial *)pTVar2,(TextureMap *)pMVar1,&local_148,aiTextureType_REFLECTION,
             local_28);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  pTVar2 = textures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"DisplacementColor",&local_171);
  TrySetTextureProperties
            (this,(aiMaterial *)pTVar2,(TextureMap *)pMVar1,&local_170,aiTextureType_DISPLACEMENT,
             local_28);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  pTVar2 = textures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,"NormalMap",&local_199);
  TrySetTextureProperties
            (this,(aiMaterial *)pTVar2,(TextureMap *)pMVar1,&local_198,aiTextureType_NORMALS,
             local_28);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  pTVar2 = textures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c0,"Bump",&local_1c1);
  TrySetTextureProperties
            (this,(aiMaterial *)pTVar2,(TextureMap *)pMVar1,&local_1c0,aiTextureType_HEIGHT,local_28
            );
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  pTVar2 = textures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e8,"ShininessExponent",&local_1e9);
  TrySetTextureProperties
            (this,(aiMaterial *)pTVar2,(TextureMap *)pMVar1,&local_1e8,aiTextureType_SHININESS,
             local_28);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  pTVar2 = textures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_210,"TransparencyFactor",&local_211);
  TrySetTextureProperties
            (this,(aiMaterial *)pTVar2,(TextureMap *)pMVar1,&local_210,aiTextureType_OPACITY,
             local_28);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  pTVar2 = textures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_238,"EmissiveFactor",&local_239);
  TrySetTextureProperties
            (this,(aiMaterial *)pTVar2,(TextureMap *)pMVar1,&local_238,aiTextureType_EMISSIVE,
             local_28);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  pTVar2 = textures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_260,"Maya|DiffuseTexture",&local_261);
  TrySetTextureProperties
            (this,(aiMaterial *)pTVar2,(TextureMap *)pMVar1,&local_260,aiTextureType_DIFFUSE,
             local_28);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  pTVar2 = textures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_288,"Maya|NormalTexture",&local_289);
  TrySetTextureProperties
            (this,(aiMaterial *)pTVar2,(TextureMap *)pMVar1,&local_288,aiTextureType_NORMALS,
             local_28);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  pTVar2 = textures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b0,"Maya|SpecularTexture",&local_2b1);
  TrySetTextureProperties
            (this,(aiMaterial *)pTVar2,(TextureMap *)pMVar1,&local_2b0,aiTextureType_SPECULAR,
             local_28);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  pTVar2 = textures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2d8,"Maya|FalloffTexture",&local_2d9);
  TrySetTextureProperties
            (this,(aiMaterial *)pTVar2,(TextureMap *)pMVar1,&local_2d8,aiTextureType_OPACITY,
             local_28);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  pTVar2 = textures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_300,"Maya|ReflectionMapTexture",&local_301);
  TrySetTextureProperties
            (this,(aiMaterial *)pTVar2,(TextureMap *)pMVar1,&local_300,aiTextureType_REFLECTION,
             local_28);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  pTVar2 = textures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_328,"Maya|baseColor|file",&local_329);
  TrySetTextureProperties
            (this,(aiMaterial *)pTVar2,(TextureMap *)pMVar1,&local_328,aiTextureType_BASE_COLOR,
             local_28);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  pTVar2 = textures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_350,"Maya|normalCamera|file",&local_351);
  TrySetTextureProperties
            (this,(aiMaterial *)pTVar2,(TextureMap *)pMVar1,&local_350,aiTextureType_NORMAL_CAMERA,
             local_28);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator((allocator<char> *)&local_351);
  pTVar2 = textures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_378,"Maya|emissionColor|file",&local_379);
  TrySetTextureProperties
            (this,(aiMaterial *)pTVar2,(TextureMap *)pMVar1,&local_378,aiTextureType_EMISSION_COLOR,
             local_28);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator((allocator<char> *)&local_379);
  pTVar2 = textures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3a0,"Maya|metalness|file",&local_3a1);
  TrySetTextureProperties
            (this,(aiMaterial *)pTVar2,(TextureMap *)pMVar1,&local_3a0,aiTextureType_METALNESS,
             local_28);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
  pTVar2 = textures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3c8,"Maya|diffuseRoughness|file",&local_3c9);
  TrySetTextureProperties
            (this,(aiMaterial *)pTVar2,(TextureMap *)pMVar1,&local_3c8,
             aiTextureType_DIFFUSE_ROUGHNESS,local_28);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
  pTVar2 = textures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3f0,"Maya|TEX_color_map|file",&local_3f1);
  TrySetTextureProperties
            (this,(aiMaterial *)pTVar2,(TextureMap *)pMVar1,&local_3f0,aiTextureType_BASE_COLOR,
             local_28);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
  pTVar2 = textures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_418,"Maya|TEX_normal_map|file",&local_419);
  TrySetTextureProperties
            (this,(aiMaterial *)pTVar2,(TextureMap *)pMVar1,&local_418,aiTextureType_NORMAL_CAMERA,
             local_28);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator((allocator<char> *)&local_419);
  pTVar2 = textures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_440,"Maya|TEX_emissive_map|file",&local_441);
  TrySetTextureProperties
            (this,(aiMaterial *)pTVar2,(TextureMap *)pMVar1,&local_440,aiTextureType_EMISSION_COLOR,
             local_28);
  std::__cxx11::string::~string((string *)&local_440);
  std::allocator<char>::~allocator((allocator<char> *)&local_441);
  pTVar2 = textures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_468,"Maya|TEX_metallic_map|file",&local_469);
  TrySetTextureProperties
            (this,(aiMaterial *)pTVar2,(TextureMap *)pMVar1,&local_468,aiTextureType_METALNESS,
             local_28);
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator((allocator<char> *)&local_469);
  pTVar2 = textures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_490,"Maya|TEX_roughness_map|file",&local_491);
  TrySetTextureProperties
            (this,(aiMaterial *)pTVar2,(TextureMap *)pMVar1,&local_490,
             aiTextureType_DIFFUSE_ROUGHNESS,local_28);
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator((allocator<char> *)&local_491);
  pTVar2 = textures_local;
  pMVar1 = mesh_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4b8,"Maya|TEX_ao_map|file",&local_4b9);
  TrySetTextureProperties
            (this,(aiMaterial *)pTVar2,(TextureMap *)pMVar1,&local_4b8,
             aiTextureType_AMBIENT_OCCLUSION,local_28);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
  return;
}

Assistant:

void FBXConverter::SetTextureProperties(aiMaterial* out_mat, const TextureMap& textures, const MeshGeometry* const mesh)
        {
            TrySetTextureProperties(out_mat, textures, "DiffuseColor", aiTextureType_DIFFUSE, mesh);
            TrySetTextureProperties(out_mat, textures, "AmbientColor", aiTextureType_AMBIENT, mesh);
            TrySetTextureProperties(out_mat, textures, "EmissiveColor", aiTextureType_EMISSIVE, mesh);
            TrySetTextureProperties(out_mat, textures, "SpecularColor", aiTextureType_SPECULAR, mesh);
            TrySetTextureProperties(out_mat, textures, "SpecularFactor", aiTextureType_SPECULAR, mesh);
            TrySetTextureProperties(out_mat, textures, "TransparentColor", aiTextureType_OPACITY, mesh);
            TrySetTextureProperties(out_mat, textures, "ReflectionColor", aiTextureType_REFLECTION, mesh);
            TrySetTextureProperties(out_mat, textures, "DisplacementColor", aiTextureType_DISPLACEMENT, mesh);
            TrySetTextureProperties(out_mat, textures, "NormalMap", aiTextureType_NORMALS, mesh);
            TrySetTextureProperties(out_mat, textures, "Bump", aiTextureType_HEIGHT, mesh);
            TrySetTextureProperties(out_mat, textures, "ShininessExponent", aiTextureType_SHININESS, mesh);
			TrySetTextureProperties( out_mat, textures, "TransparencyFactor", aiTextureType_OPACITY, mesh );
			TrySetTextureProperties( out_mat, textures, "EmissiveFactor", aiTextureType_EMISSIVE, mesh );
            //Maya counterparts
            TrySetTextureProperties(out_mat, textures, "Maya|DiffuseTexture", aiTextureType_DIFFUSE, mesh);
            TrySetTextureProperties(out_mat, textures, "Maya|NormalTexture", aiTextureType_NORMALS, mesh);
            TrySetTextureProperties(out_mat, textures, "Maya|SpecularTexture", aiTextureType_SPECULAR, mesh);
            TrySetTextureProperties(out_mat, textures, "Maya|FalloffTexture", aiTextureType_OPACITY, mesh);
            TrySetTextureProperties(out_mat, textures, "Maya|ReflectionMapTexture", aiTextureType_REFLECTION, mesh);
            
            // Maya PBR
            TrySetTextureProperties(out_mat, textures, "Maya|baseColor|file", aiTextureType_BASE_COLOR, mesh);
            TrySetTextureProperties(out_mat, textures, "Maya|normalCamera|file", aiTextureType_NORMAL_CAMERA, mesh);
            TrySetTextureProperties(out_mat, textures, "Maya|emissionColor|file", aiTextureType_EMISSION_COLOR, mesh);
            TrySetTextureProperties(out_mat, textures, "Maya|metalness|file", aiTextureType_METALNESS, mesh);
            TrySetTextureProperties(out_mat, textures, "Maya|diffuseRoughness|file", aiTextureType_DIFFUSE_ROUGHNESS, mesh);
            
            // Maya stingray
            TrySetTextureProperties(out_mat, textures, "Maya|TEX_color_map|file", aiTextureType_BASE_COLOR, mesh);
            TrySetTextureProperties(out_mat, textures, "Maya|TEX_normal_map|file", aiTextureType_NORMAL_CAMERA, mesh);
            TrySetTextureProperties(out_mat, textures, "Maya|TEX_emissive_map|file", aiTextureType_EMISSION_COLOR, mesh);
            TrySetTextureProperties(out_mat, textures, "Maya|TEX_metallic_map|file", aiTextureType_METALNESS, mesh);
            TrySetTextureProperties(out_mat, textures, "Maya|TEX_roughness_map|file", aiTextureType_DIFFUSE_ROUGHNESS, mesh);
            TrySetTextureProperties(out_mat, textures, "Maya|TEX_ao_map|file", aiTextureType_AMBIENT_OCCLUSION, mesh);            
        }